

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O3

void __thiscall
duckdb::InMemoryLogStorage::InMemoryLogStorage(InMemoryLogStorage *this,DatabaseInstance *db_p)

{
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var1;
  pointer pDVar2;
  Allocator *pAVar3;
  BufferManager *pBVar4;
  ColumnDataCollection *pCVar5;
  long lVar6;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  vector<duckdb::LogicalType,_true> log_context_schema;
  vector<duckdb::LogicalType,_true> log_entry_schema;
  allocator_type local_101;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  *local_100;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  *local_f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d8;
  LogicalType local_c0 [4];
  LogicalType local_60;
  LogicalType local_48;
  
  (this->super_LogStorage)._vptr_LogStorage = (_func_int **)&PTR__InMemoryLogStorage_0196f658;
  local_f8 = &this->log_entries;
  local_100 = &this->log_contexts;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->log_entries).
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
       (ColumnDataCollection *)0x0;
  (this->log_contexts).
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
       (ColumnDataCollection *)0x0;
  (this->registered_contexts)._M_h._M_buckets = &(this->registered_contexts)._M_h._M_single_bucket;
  (this->registered_contexts)._M_h._M_bucket_count = 1;
  (this->registered_contexts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->registered_contexts)._M_h._M_element_count = 0;
  (this->registered_contexts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->registered_contexts)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->registered_contexts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  _Var1._M_head_impl = (DataChunk *)operator_new(0x40);
  DataChunk::DataChunk(_Var1._M_head_impl);
  (this->entry_buffer).super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
  _M_t.super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
  super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = _Var1._M_head_impl;
  _Var1._M_head_impl = (DataChunk *)operator_new(0x40);
  DataChunk::DataChunk(_Var1._M_head_impl);
  (this->log_context_buffer).
  super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
  super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = _Var1._M_head_impl;
  LogicalType::LogicalType(local_c0,UBIGINT);
  LogicalType::LogicalType(local_c0 + 1,TIMESTAMP);
  LogicalType::LogicalType(local_c0 + 2,VARCHAR);
  LogicalType::LogicalType(local_c0 + 3,VARCHAR);
  LogicalType::LogicalType(&local_60,VARCHAR);
  __l._M_len = 5;
  __l._M_array = local_c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_d8,__l,
             (allocator_type *)&local_f0);
  lVar6 = 0x60;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_c0[0].id_ + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  LogicalType::LogicalType(local_c0,UBIGINT);
  LogicalType::LogicalType(local_c0 + 1,VARCHAR);
  LogicalType::LogicalType(local_c0 + 2,UBIGINT);
  LogicalType::LogicalType(local_c0 + 3,UBIGINT);
  LogicalType::LogicalType(&local_60,UBIGINT);
  LogicalType::LogicalType(&local_48,UBIGINT);
  __l_00._M_len = 6;
  __l_00._M_array = local_c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_f0,__l_00,
             &local_101);
  lVar6 = 0x78;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_c0[0].id_ + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  this->max_buffer_size = 0x800;
  pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (&this->entry_buffer);
  pAVar3 = Allocator::DefaultAllocator();
  DataChunk::Initialize
            (pDVar2,pAVar3,(vector<duckdb::LogicalType,_true> *)&local_d8,this->max_buffer_size);
  pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (&this->log_context_buffer);
  pAVar3 = Allocator::DefaultAllocator();
  DataChunk::Initialize
            (pDVar2,pAVar3,(vector<duckdb::LogicalType,_true> *)&local_f0,this->max_buffer_size);
  pBVar4 = DatabaseInstance::GetBufferManager(db_p);
  pCVar5 = (ColumnDataCollection *)operator_new(0x70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_c0,&local_d8
            );
  ColumnDataCollection::ColumnDataCollection
            (pCVar5,pBVar4,(vector<duckdb::LogicalType,_true> *)local_c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_c0);
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)local_f8,pCVar5);
  pBVar4 = DatabaseInstance::GetBufferManager(db_p);
  pCVar5 = (ColumnDataCollection *)operator_new(0x70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_c0,&local_f0
            );
  ColumnDataCollection::ColumnDataCollection
            (pCVar5,pBVar4,(vector<duckdb::LogicalType,_true> *)local_c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_c0);
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)local_100,pCVar5);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_f0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_d8);
  return;
}

Assistant:

InMemoryLogStorage::InMemoryLogStorage(DatabaseInstance &db_p)
    : entry_buffer(make_uniq<DataChunk>()), log_context_buffer(make_uniq<DataChunk>()) {
	// LogEntry Schema
	vector<LogicalType> log_entry_schema = {
	    LogicalType::UBIGINT,   // context_id
	    LogicalType::TIMESTAMP, // timestamp
	    LogicalType::VARCHAR,   // log_type TODO: const vector where possible?
	    LogicalType::VARCHAR,   // level TODO: enumify
	    LogicalType::VARCHAR,   // message
	};

	// LogContext Schema
	vector<LogicalType> log_context_schema = {
	    LogicalType::UBIGINT, // context_id
	    LogicalType::VARCHAR, // scope TODO: enumify
	    LogicalType::UBIGINT, // connection_id
	    LogicalType::UBIGINT, // transaction_id
	    LogicalType::UBIGINT, // query_id
	    LogicalType::UBIGINT, // thread
	};

	max_buffer_size = STANDARD_VECTOR_SIZE;
	entry_buffer->Initialize(Allocator::DefaultAllocator(), log_entry_schema, max_buffer_size);
	log_context_buffer->Initialize(Allocator::DefaultAllocator(), log_context_schema, max_buffer_size);
	log_entries = make_uniq<ColumnDataCollection>(db_p.GetBufferManager(), log_entry_schema);
	log_contexts = make_uniq<ColumnDataCollection>(db_p.GetBufferManager(), log_context_schema);
}